

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O0

bool __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Equals(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
         *this,ISourceHolder *other)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  LPCUTF8 puVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool local_39;
  bool local_29;
  bool local_19;
  ISourceHolder *other_local;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *this_local;
  
  local_19 = true;
  if (this != (JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
               *)other) {
    sVar2 = GetByteLength(this,L"Equal Comparison");
    iVar1 = (*(other->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(other,L"Equal Comparison");
    local_29 = false;
    if (sVar2 == CONCAT44(extraout_var,iVar1)) {
      puVar3 = GetSource(this,L"Equal Comparison");
      iVar1 = (*(other->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[6])(other,L"Equal Comparison");
      local_39 = true;
      if (puVar3 != (LPCUTF8)CONCAT44(extraout_var_00,iVar1)) {
        puVar3 = GetSource(this,L"Equal Comparison");
        iVar1 = (*(other->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(other,L"Equal Comparison");
        sVar2 = GetByteLength(this,L"Equal Comparison");
        iVar1 = memcmp(puVar3,(void *)CONCAT44(extraout_var_01,iVar1),sVar2);
        local_39 = iVar1 == 0;
      }
      local_29 = local_39;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

virtual bool Equals(ISourceHolder* other) override
        {
            return this == other ||
                (this->GetByteLength(_u("Equal Comparison")) == other->GetByteLength(_u("Equal Comparison"))
                    && (this->GetSource(_u("Equal Comparison")) == other->GetSource(_u("Equal Comparison"))
                        || memcmp(this->GetSource(_u("Equal Comparison")), other->GetSource(_u("Equal Comparison")), this->GetByteLength(_u("Equal Comparison"))) == 0));
        }